

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_engine_base.cpp
# Opt level: O1

int __thiscall zmq::stream_engine_base_t::pull_and_encode(stream_engine_base_t *this,msg_t *msg_)

{
  int iVar1;
  
  if (this->_mechanism == (mechanism_t *)0x0) {
    pull_and_encode();
  }
  iVar1 = (*(this->_session->super_own_t).super_object_t._vptr_object_t[0x1e])(this->_session,msg_);
  if (iVar1 == -1) {
    iVar1 = -1;
  }
  else {
    iVar1 = (*this->_mechanism->_vptr_mechanism_t[4])(this->_mechanism,msg_);
    iVar1 = -(uint)(iVar1 == -1);
  }
  return iVar1;
}

Assistant:

int zmq::stream_engine_base_t::pull_and_encode (msg_t *msg_)
{
    zmq_assert (_mechanism != NULL);

    if (_session->pull_msg (msg_) == -1)
        return -1;
    if (_mechanism->encode (msg_) == -1)
        return -1;
    return 0;
}